

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iraffits.c
# Opt level: O0

int iraftofits(char *hdrname,char *irafheader,int nbiraf,char **buffptr,size_t *nbfits,
              size_t *fitssize,int *status)

{
  char cVar1;
  undefined1 auVar2 [16];
  int iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  size_t sVar7;
  char *pcVar8;
  undefined8 *in_RCX;
  ulong uVar9;
  int in_EDX;
  char *in_RSI;
  size_t *in_R8;
  long *in_R9;
  int *in_stack_00000008;
  char errmsg [81];
  int impixtype;
  int imphyslen;
  int imlen;
  int imndim;
  int impixoff;
  int pixoff;
  int imu;
  int n;
  int imhver;
  int pixtype;
  char fitsline [81];
  char irafchar;
  char endline [81];
  char *fp;
  char *fhead1;
  char *fhead;
  int nlines;
  int nblock;
  char *fitsheader;
  char *chead;
  char *bang;
  char *newpixname;
  char *pixname;
  int nbits;
  int nax;
  int ib;
  int k;
  int j;
  int i;
  int lstr;
  char *objname;
  char *in_stack_fffffffffffffe08;
  undefined8 in_stack_fffffffffffffe10;
  int in_stack_fffffffffffffe18;
  int in_stack_fffffffffffffe1c;
  int in_stack_fffffffffffffe20;
  int in_stack_fffffffffffffe24;
  char *in_stack_fffffffffffffe28;
  char *in_stack_fffffffffffffe30;
  char *in_stack_fffffffffffffe48;
  char *in_stack_fffffffffffffe50;
  char *in_stack_fffffffffffffe60;
  char *in_stack_fffffffffffffe68;
  int offset;
  undefined4 uVar10;
  char local_168 [24];
  char *in_stack_fffffffffffffeb0;
  char *in_stack_fffffffffffffeb8;
  char *in_stack_fffffffffffffec0;
  char local_108 [80];
  undefined1 local_b8;
  char *local_a8;
  char *local_a0;
  char *local_98;
  int local_90;
  int local_8c;
  char *local_88;
  char *local_80;
  char *local_78;
  char *local_70;
  char *local_68;
  undefined4 local_5c;
  int local_58;
  uint local_54;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  char *local_40;
  long *local_38;
  size_t *local_30;
  undefined8 *local_28;
  int local_1c;
  char *local_18;
  int local_4;
  
  iVar4 = (int)((ulong)in_stack_fffffffffffffe10 >> 0x20);
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_1c = in_EDX;
  local_18 = in_RSI;
  strncpy(local_108,"END",3);
  for (local_48 = 3; local_48 < 0x50; local_48 = local_48 + 1) {
    local_108[local_48] = ' ';
  }
  local_b8 = 0;
  iVar3 = head_version(in_stack_fffffffffffffe08);
  if (iVar3 < 1) {
    ffpmsg((char *)0x21c701);
    ffpmsg((char *)0x21c70e);
    *in_stack_00000008 = 0x68;
    local_4 = 0x68;
  }
  else {
    if (iVar3 == 2) {
      local_90 = (local_1c + -0x7fe) / 0x51;
      uVar10 = 0x32;
      offset = 10;
    }
    else {
      local_90 = (local_1c + -0x804) / 0xa2;
      uVar10 = 0x34;
      offset = 0x10;
    }
    local_90 = local_90 + 0x18;
    local_8c = (local_90 * 0x50) / 0xb40;
    *local_30 = (long)((local_8c + 5) * 0xb40 + 4);
    local_98 = (char *)calloc(*local_30,1);
    local_88 = local_98;
    if (local_98 == (char *)0x0) {
      snprintf(&stack0xfffffffffffffe18,0x51,"IRAF2FITS Cannot allocate %d-byte FITS header",
               *local_30 & 0xffffffff);
      ffpmsg((char *)0x21c856);
      *in_stack_00000008 = 0x68;
      local_4 = 0x68;
    }
    else {
      *local_28 = local_98;
      strncpy(local_98,local_108,0x50);
      hputl((char *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
            (char *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),iVar4);
      local_98 = local_98 + 0x50;
      swaphead = isirafswapped(local_18,offset);
      iVar4 = swaphead;
      if (iVar3 != 1) {
        iVar4 = irafgeti4((char *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                          in_stack_fffffffffffffe1c);
      }
      swapdata = iVar4;
      uVar5 = irafgeti4((char *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                        in_stack_fffffffffffffe1c);
      uVar9 = (ulong)(uVar5 - 2);
      switch(uVar9) {
      case 0:
        local_5c = 8;
        break;
      case 1:
        local_5c = 0x10;
        break;
      case 2:
      case 3:
        local_5c = 0x20;
        break;
      case 4:
        local_5c = 0xffffffe0;
        break;
      case 5:
        local_5c = 0xffffffc0;
        break;
      default:
        snprintf(&stack0xfffffffffffffe18,0x51,"Unsupported IRAF data type: %d",(ulong)uVar5);
        ffpmsg((char *)0x21c9f5);
        ffpmsg((char *)0x21ca02);
        *in_stack_00000008 = 0x68;
        return 0x68;
      case 9:
        local_5c = 0xfffffff0;
        break;
      case 10:
        local_5c = 8;
      }
      hputi4(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe24);
      iVar4 = (int)(uVar9 >> 0x20);
      hputcom(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
      local_98 = local_98 + 0x50;
      local_58 = irafgeti4((char *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                           in_stack_fffffffffffffe1c);
      hputi4(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe24);
      hputcom(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
      local_98 = local_98 + 0x50;
      irafgeti4((char *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                in_stack_fffffffffffffe1c);
      hputi4(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe24);
      hputcom(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
      local_98 = local_98 + 0x50;
      if (1 < local_58) {
        irafgeti4((char *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                  in_stack_fffffffffffffe1c);
        hputi4(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe24);
        hputcom(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
        local_98 = local_98 + 0x50;
      }
      if (2 < local_58) {
        irafgeti4((char *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                  in_stack_fffffffffffffe1c);
        hputi4(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe24);
        hputcom(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
        local_98 = local_98 + 0x50;
      }
      if (3 < local_58) {
        irafgeti4((char *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                  in_stack_fffffffffffffe1c);
        hputi4(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe24);
        hputcom(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
        local_98 = local_98 + 0x50;
      }
      if (iVar3 == 2) {
        local_40 = irafgetc(in_stack_fffffffffffffe28,in_stack_fffffffffffffe24,
                            in_stack_fffffffffffffe20);
      }
      else {
        local_40 = irafgetc2((char *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                             in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18);
      }
      sVar7 = strlen(local_40);
      local_44 = (int)sVar7;
      iVar6 = local_44;
      if (local_44 < 8) {
        while (local_48 = iVar6, local_48 < 8) {
          local_40[local_48] = ' ';
          iVar6 = local_48 + 1;
        }
        local_40[8] = '\0';
      }
      hputs((char *)CONCAT44(uVar10,offset),in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
      hputcom(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
      free(local_40);
      local_98 = local_98 + 0x50;
      irafgeti4((char *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                in_stack_fffffffffffffe1c);
      hputi4(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe24);
      hputcom(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
      local_98 = local_98 + 0x50;
      if (1 < local_58) {
        irafgeti4((char *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                  in_stack_fffffffffffffe1c);
        hputi4(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe24);
        hputcom(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
        local_98 = local_98 + 0x50;
      }
      if (2 < local_58) {
        irafgeti4((char *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                  in_stack_fffffffffffffe1c);
        hputi4(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe24);
        hputcom(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
        local_98 = local_98 + 0x50;
      }
      if (3 < local_58) {
        irafgeti4((char *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                  in_stack_fffffffffffffe1c);
        hputi4(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe24);
        hputcom(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
        local_98 = local_98 + 0x50;
      }
      hputs((char *)CONCAT44(uVar10,offset),in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
      hputcom(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
      local_98 = local_98 + 0x50;
      if (iVar3 == 2) {
        local_68 = irafgetc(in_stack_fffffffffffffe28,in_stack_fffffffffffffe24,
                            in_stack_fffffffffffffe20);
      }
      else {
        local_68 = irafgetc2((char *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                             in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18);
      }
      iVar6 = strncmp(local_68,"HDR",3);
      if ((iVar6 == 0) &&
         (local_70 = same_path(in_stack_fffffffffffffe28,
                               (char *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20)
                              ), local_70 != (char *)0x0)) {
        free(local_68);
        local_68 = local_70;
      }
      pcVar8 = strchr(local_68,0x2f);
      if (((pcVar8 == (char *)0x0) && (pcVar8 = strchr(local_68,0x24), pcVar8 == (char *)0x0)) &&
         (local_70 = same_path(in_stack_fffffffffffffe28,
                               (char *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20)
                              ), local_70 != (char *)0x0)) {
        free(local_68);
        local_68 = local_70;
      }
      local_78 = strchr(local_68,0x21);
      if (local_78 == (char *)0x0) {
        hputs((char *)CONCAT44(uVar10,offset),in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
      }
      else {
        hputs((char *)CONCAT44(uVar10,offset),in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
      }
      free(local_68);
      hputcom(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
      local_98 = local_98 + 0x50;
      irafgeti4((char *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                in_stack_fffffffffffffe1c);
      hputi4(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe24);
      hputcom(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
      local_98 = local_98 + 0x50;
      hputi4(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe24);
      hputcom(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
      local_98 = local_98 + 0x50;
      if (swapdata == 0) {
        hputl((char *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
              (char *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),iVar4);
      }
      else {
        hputl((char *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
              (char *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),iVar4);
      }
      hputcom(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
      local_98 = local_98 + 0x50;
      if (iVar3 == 2) {
        local_80 = local_18;
        local_4c = 0;
        for (local_50 = 0; local_50 < 0x50; local_50 = local_50 + 1) {
          local_168[local_50] = ' ';
        }
        for (local_48 = 0x7fe; (local_48 < local_1c && (cVar1 = local_80[local_48], cVar1 != '\0'));
            local_48 = local_48 + 1) {
          if (cVar1 == '\n') {
            strncpy(local_98,local_168,0x50);
            iVar4 = strncmp(local_168,"OBJECT ",7);
            if (iVar4 != 0) {
              local_98 = local_98 + 0x50;
            }
            for (local_50 = 0; local_50 < 0x50; local_50 = local_50 + 1) {
              local_168[local_50] = ' ';
            }
            local_4c = 0;
          }
          else {
            if (0x50 < local_4c) {
              iVar4 = strncmp(local_168,"OBJECT ",7);
              if (iVar4 != 0) {
                strncpy(local_98,local_168,0x50);
                local_4c = 9;
                local_98 = local_98 + 0x50;
              }
              for (local_50 = 0; local_50 < 0x50; local_50 = local_50 + 1) {
                local_168[local_50] = ' ';
              }
            }
            if ((' ' < cVar1) && (cVar1 < '\x7f')) {
              local_168[local_4c] = cVar1;
            }
            local_4c = local_4c + 1;
          }
        }
      }
      else {
        local_80 = local_18;
        local_54 = (uint)(swaphead != 1);
        for (local_50 = 0; local_50 < 0x50; local_50 = local_50 + 1) {
          local_168[local_50] = ' ';
        }
        local_4c = 0;
        local_48 = 0x804;
        while ((local_48 < local_1c && (cVar1 = local_80[(int)(local_48 + local_54)], cVar1 != '\0')
               )) {
          if (cVar1 == '\n') {
            iVar4 = strncmp(local_168,"OBJECT ",7);
            if (iVar4 != 0) {
              strncpy(local_98,local_168,0x50);
              local_98 = local_98 + 0x50;
            }
            local_4c = 0;
            for (local_50 = 0; local_50 < 0x50; local_50 = local_50 + 1) {
              local_168[local_50] = ' ';
            }
          }
          else {
            if (0x50 < local_4c) {
              iVar4 = strncmp(local_168,"OBJECT ",7);
              if (iVar4 != 0) {
                strncpy(local_98,local_168,0x50);
                local_4c = 9;
                local_98 = local_98 + 0x50;
              }
              for (local_50 = 0; local_50 < 0x50; local_50 = local_50 + 1) {
                local_168[local_50] = ' ';
              }
            }
            if ((' ' < cVar1) && (cVar1 < '\x7f')) {
              local_168[local_4c] = cVar1;
            }
            local_4c = local_4c + 1;
          }
          local_48 = local_48 + 2;
        }
      }
      strncpy(local_98,local_108,0x50);
      local_98 = ksearch(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
      local_98 = local_98 + 0x50;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = *local_30;
      local_8c = SUB164(auVar2 / ZEXT816(0xb40),0);
      local_a0 = local_88 + local_8c * 0xb40;
      *local_38 = (long)local_98 - (long)local_88;
      strncpy(local_108,"   ",3);
      for (local_a8 = local_98; local_a8 < local_a0; local_a8 = local_a8 + 0x50) {
        strncpy(local_a8,local_108,0x50);
      }
      local_4 = *in_stack_00000008;
    }
  }
  return local_4;
}

Assistant:

static int iraftofits (
    char    *hdrname,  /* IRAF header file name (may be path) */
    char    *irafheader,  /* IRAF image header */
    int	    nbiraf,	  /* Number of bytes in IRAF header */
    char    **buffptr,    /* pointer to the FITS header  */
    size_t  *nbfits,      /* allocated size of the FITS header buffer */
    size_t  *fitssize,  /* Number of bytes in FITS header (returned) */
                        /*  = number of bytes to the end of the END keyword */
    int     *status)
{
    char *objname;	/* object name from FITS file */
    int lstr, i, j, k, ib, nax, nbits;
    char *pixname, *newpixname, *bang, *chead;
    char *fitsheader;
    int nblock, nlines;
    char *fhead, *fhead1, *fp, endline[81];
    char irafchar;
    char fitsline[81];
    int pixtype;
    int imhver, n, imu, pixoff, impixoff;
/*    int immax, immin, imtime;  */
    int imndim, imlen, imphyslen, impixtype;
    char errmsg[FLEN_ERRMSG];

    /* Set up last line of FITS header */
    (void)strncpy (endline,"END", 3);
    for (i = 3; i < 80; i++)
	endline[i] = ' ';
    endline[80] = 0;

    /* Check header magic word */
    imhver = head_version (irafheader);
    if (imhver < 1) {
	ffpmsg("File not valid IRAF image header");
        ffpmsg(hdrname);
	return(*status = FILE_NOT_OPENED);
	}
    if (imhver == 2) {
	nlines = 24 + ((nbiraf - LEN_IM2HDR) / 81);
	imndim = IM2_NDIM;
	imlen = IM2_LEN;
	imphyslen = IM2_PHYSLEN;
	impixtype = IM2_PIXTYPE;
	impixoff = IM2_PIXOFF;
/*	imtime = IM2_MTIME; */
/*	immax = IM2_MAX;  */
/*	immin = IM2_MIN; */
	}
    else {
	nlines = 24 + ((nbiraf - LEN_IMHDR) / 162);
	imndim = IM_NDIM;
	imlen = IM_LEN;
	imphyslen = IM_PHYSLEN;
	impixtype = IM_PIXTYPE;
	impixoff = IM_PIXOFF;
/*	imtime = IM_MTIME; */
/*	immax = IM_MAX; */
/*	immin = IM_MIN; */
	}

    /*  Initialize FITS header */
    nblock = (nlines * 80) / 2880;
    *nbfits = (nblock + 5) * 2880 + 4;
    fitsheader = (char *) calloc (*nbfits, 1);
    if (fitsheader == NULL) {
	snprintf(errmsg, FLEN_ERRMSG,"IRAF2FITS Cannot allocate %d-byte FITS header",
		(int) (*nbfits));
        ffpmsg(hdrname);
	return (*status = FILE_NOT_OPENED);
	}

    fhead = fitsheader;
    *buffptr = fitsheader;
    (void)strncpy (fitsheader, endline, 80);
    hputl (fitsheader, "SIMPLE", 1);
    fhead = fhead + 80;

    /*  check if the IRAF file is in big endian (sun) format (= 0) or not. */
    /*  This is done by checking the 4 byte integer in the header that     */
    /*  represents the iraf pixel type.  This 4-byte word is guaranteed to */
    /*  have the least sig byte != 0 and the most sig byte = 0,  so if the */
    /*  first byte of the word != 0, then the file in little endian format */
    /*  like on an Alpha machine.                                          */

    swaphead = isirafswapped(irafheader, impixtype);
    if (imhver == 1)
        swapdata = swaphead; /* vers 1 data has same swapness as header */
    else
        swapdata = irafgeti4 (irafheader, IM2_SWAPPED); 

    /*  Set pixel size in FITS header */
    pixtype = irafgeti4 (irafheader, impixtype);
    switch (pixtype) {
	case TY_CHAR:
	    nbits = 8;
	    break;
	case TY_UBYTE:
	    nbits = 8;
	    break;
	case TY_SHORT:
	    nbits = 16;
	    break;
	case TY_USHORT:
	    nbits = -16;
	    break;
	case TY_INT:
	case TY_LONG:
	    nbits = 32;
	    break;
	case TY_REAL:
	    nbits = -32;
	    break;
	case TY_DOUBLE:
	    nbits = -64;
	    break;
	default:
	    snprintf(errmsg,FLEN_ERRMSG,"Unsupported IRAF data type: %d", pixtype);
            ffpmsg(errmsg);
            ffpmsg(hdrname);
	    return (*status = FILE_NOT_OPENED);
	}
    hputi4 (fitsheader,"BITPIX",nbits);
    hputcom (fitsheader,"BITPIX", "IRAF .imh pixel type");
    fhead = fhead + 80;

    /*  Set image dimensions in FITS header */
    nax = irafgeti4 (irafheader, imndim);
    hputi4 (fitsheader,"NAXIS",nax);
    hputcom (fitsheader,"NAXIS", "IRAF .imh naxis");
    fhead = fhead + 80;

    n = irafgeti4 (irafheader, imlen);
    hputi4 (fitsheader, "NAXIS1", n);
    hputcom (fitsheader,"NAXIS1", "IRAF .imh image naxis[1]");
    fhead = fhead + 80;

    if (nax > 1) {
	n = irafgeti4 (irafheader, imlen+4);
	hputi4 (fitsheader, "NAXIS2", n);
	hputcom (fitsheader,"NAXIS2", "IRAF .imh image naxis[2]");
        fhead = fhead + 80;
	}
    if (nax > 2) {
	n = irafgeti4 (irafheader, imlen+8);
	hputi4 (fitsheader, "NAXIS3", n);
	hputcom (fitsheader,"NAXIS3", "IRAF .imh image naxis[3]");
	fhead = fhead + 80;
	}
    if (nax > 3) {
	n = irafgeti4 (irafheader, imlen+12);
	hputi4 (fitsheader, "NAXIS4", n);
	hputcom (fitsheader,"NAXIS4", "IRAF .imh image naxis[4]");
	fhead = fhead + 80;
	}

    /* Set object name in FITS header */
    if (imhver == 2)
	objname = irafgetc (irafheader, IM2_TITLE, SZ_IM2TITLE);
    else
	objname = irafgetc2 (irafheader, IM_TITLE, SZ_IMTITLE);
    if ((lstr = strlen (objname)) < 8) {
	for (i = lstr; i < 8; i++)
	    objname[i] = ' ';
	objname[8] = 0;
	}
    hputs (fitsheader,"OBJECT",objname);
    hputcom (fitsheader,"OBJECT", "IRAF .imh title");
    free (objname);
    fhead = fhead + 80;

    /* Save physical axis lengths so image file can be read */
    n = irafgeti4 (irafheader, imphyslen);
    hputi4 (fitsheader, "NPAXIS1", n);
    hputcom (fitsheader,"NPAXIS1", "IRAF .imh physical naxis[1]");
    fhead = fhead + 80;
    if (nax > 1) {
	n = irafgeti4 (irafheader, imphyslen+4);
	hputi4 (fitsheader, "NPAXIS2", n);
	hputcom (fitsheader,"NPAXIS2", "IRAF .imh physical naxis[2]");
	fhead = fhead + 80;
	}
    if (nax > 2) {
	n = irafgeti4 (irafheader, imphyslen+8);
	hputi4 (fitsheader, "NPAXIS3", n);
	hputcom (fitsheader,"NPAXIS3", "IRAF .imh physical naxis[3]");
	fhead = fhead + 80;
	}
    if (nax > 3) {
	n = irafgeti4 (irafheader, imphyslen+12);
	hputi4 (fitsheader, "NPAXIS4", n);
	hputcom (fitsheader,"NPAXIS4", "IRAF .imh physical naxis[4]");
	fhead = fhead + 80;
	}

    /* Save image header filename in header */
    hputs (fitsheader,"IMHFILE",hdrname);
    hputcom (fitsheader,"IMHFILE", "IRAF header file name");
    fhead = fhead + 80;

    /* Save image pixel file pathname in header */
    if (imhver == 2)
	pixname = irafgetc (irafheader, IM2_PIXFILE, SZ_IM2PIXFILE);
    else
	pixname = irafgetc2 (irafheader, IM_PIXFILE, SZ_IMPIXFILE);
    if (strncmp(pixname, "HDR", 3) == 0 ) {
	newpixname = same_path (pixname, hdrname);
        if (newpixname) {
          free (pixname);
          pixname = newpixname;
	  }
	}
    if (strchr (pixname, '/') == NULL && strchr (pixname, '$') == NULL) {
	newpixname = same_path (pixname, hdrname);
        if (newpixname) {
          free (pixname);
          pixname = newpixname;
	  }
	}
	
    if ((bang = strchr (pixname, '!')) != NULL )
	hputs (fitsheader,"PIXFILE",bang+1);
    else
	hputs (fitsheader,"PIXFILE",pixname);
    free (pixname);
    hputcom (fitsheader,"PIXFILE", "IRAF .pix pixel file");
    fhead = fhead + 80;

    /* Save image offset from star of pixel file */
    pixoff = irafgeti4 (irafheader, impixoff);
    pixoff = (pixoff - 1) * 2;
    hputi4 (fitsheader, "PIXOFF", pixoff);
    hputcom (fitsheader,"PIXOFF", "IRAF .pix pixel offset (Do not change!)");
    fhead = fhead + 80;

    /* Save IRAF file format version in header */
    hputi4 (fitsheader,"IMHVER",imhver);
    hputcom (fitsheader,"IMHVER", "IRAF .imh format version (1 or 2)");
    fhead = fhead + 80;

    /* Save flag as to whether to swap IRAF data for this file and machine */
    if (swapdata)
	hputl (fitsheader, "PIXSWAP", 1);
    else
	hputl (fitsheader, "PIXSWAP", 0);
    hputcom (fitsheader,"PIXSWAP", "IRAF pixels, FITS byte orders differ if T");
    fhead = fhead + 80;

    /* Add user portion of IRAF header to FITS header */
    fitsline[80] = 0;
    if (imhver == 2) {
	imu = LEN_IM2HDR;
	chead = irafheader;
	j = 0;
	for (k = 0; k < 80; k++)
	    fitsline[k] = ' ';
	for (i = imu; i < nbiraf; i++) {
	    irafchar = chead[i];
	    if (irafchar == 0)
		break;
	    else if (irafchar == 10) {
		(void)strncpy (fhead, fitsline, 80);
		/* fprintf (stderr,"%80s\n",fitsline); */
		if (strncmp (fitsline, "OBJECT ", 7) != 0) {
		    fhead = fhead + 80;
		    }
		for (k = 0; k < 80; k++)
		    fitsline[k] = ' ';
		j = 0;
		}
	    else {
		if (j > 80) {
		    if (strncmp (fitsline, "OBJECT ", 7) != 0) {
			(void)strncpy (fhead, fitsline, 80);
			/* fprintf (stderr,"%80s\n",fitsline); */
			j = 9;
			fhead = fhead + 80;
			}
		    for (k = 0; k < 80; k++)
			fitsline[k] = ' ';
		    }
		if (irafchar > 32 && irafchar < 127)
		    fitsline[j] = irafchar;
		j++;
		}
	    }
	}
    else {
	imu = LEN_IMHDR;
	chead = irafheader;
	if (swaphead == 1)
	    ib = 0;
	else
	    ib = 1;
	for (k = 0; k < 80; k++)
	    fitsline[k] = ' ';
	j = 0;
	for (i = imu; i < nbiraf; i=i+2) {
	    irafchar = chead[i+ib];
	    if (irafchar == 0)
		break;
	    else if (irafchar == 10) {
		if (strncmp (fitsline, "OBJECT ", 7) != 0) {
		    (void)strncpy (fhead, fitsline, 80);
		    fhead = fhead + 80;
		    }
		/* fprintf (stderr,"%80s\n",fitsline); */
		j = 0;
		for (k = 0; k < 80; k++)
		    fitsline[k] = ' ';
		}
	    else {
		if (j > 80) {
		    if (strncmp (fitsline, "OBJECT ", 7) != 0) {
			(void)strncpy (fhead, fitsline, 80);
			j = 9;
			fhead = fhead + 80;
			}
		    /* fprintf (stderr,"%80s\n",fitsline); */
		    for (k = 0; k < 80; k++)
			fitsline[k] = ' ';
		    }
		if (irafchar > 32 && irafchar < 127)
		    fitsline[j] = irafchar;
		j++;
		}
	    }
	}

    /* Add END to last line */
    (void)strncpy (fhead, endline, 80);

    /* Find end of last 2880-byte block of header */
    fhead = ksearch (fitsheader, "END") + 80;
    nblock = *nbfits / 2880;
    fhead1 = fitsheader + (nblock * 2880);
    *fitssize = fhead - fitsheader;  /* no. of bytes to end of END keyword */

    /* Pad rest of header with spaces */
    strncpy (endline,"   ",3);
    for (fp = fhead; fp < fhead1; fp = fp + 80) {
	(void)strncpy (fp, endline,80);
	}

    return (*status);
}